

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

string * anon_unknown.dwarf_e9e4d4::AddChecksum(string *__return_storage_ptr__,string *str)

{
  Span<const_char> *span;
  long in_FS_OFFSET;
  pointer local_68;
  size_type local_60;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+(&local_38,str,"#");
  local_68 = (str->_M_dataplus)._M_p;
  local_60 = str->_M_string_length;
  (anonymous_namespace)::DescriptorChecksum_abi_cxx11_
            (&local_58,(_anonymous_namespace_ *)&local_68,span);
  std::operator+(__return_storage_ptr__,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string AddChecksum(const std::string& str) { return str + "#" + DescriptorChecksum(str); }